

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O0

vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
* libcellml::attributesWithCellml1XNamespace
            (vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
             *__return_storage_ptr__,XmlNodePtr *node)

{
  bool bVar1;
  element_type *peVar2;
  bool local_11a;
  shared_ptr<libcellml::XmlNode> local_108;
  shared_ptr<libcellml::XmlAttribute> *local_f8;
  shared_ptr<libcellml::XmlAttribute> *local_f0;
  __normal_iterator<std::shared_ptr<libcellml::XmlAttribute>_*,_std::vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>_>
  local_e8;
  __normal_iterator<std::shared_ptr<libcellml::XmlAttribute>_*,_std::vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>_>
  local_e0;
  const_iterator local_d8;
  XmlNodePtr local_d0;
  undefined1 local_c0 [8];
  vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
  subAttributes;
  string local_90;
  string local_70;
  undefined1 local_40 [8];
  XmlAttributePtr tempAttribute;
  XmlNodePtr tempNode;
  XmlNodePtr *node_local;
  vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
  *attributes;
  
  std::
  vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
  ::vector(__return_storage_ptr__);
  std::shared_ptr<libcellml::XmlNode>::shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)
             &tempAttribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,node);
  while (bVar1 = std::operator!=((shared_ptr<libcellml::XmlNode> *)
                                 &tempAttribute.
                                  super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,(nullptr_t)0x0), bVar1) {
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &tempAttribute.
                super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    XmlNode::firstAttribute((XmlNode *)local_40);
    while (bVar1 = std::operator!=((shared_ptr<libcellml::XmlAttribute> *)local_40,(nullptr_t)0x0),
          bVar1) {
      peVar2 = std::
               __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      XmlAttribute::namespaceUri_abi_cxx11_(&local_70,peVar2);
      bVar1 = std::operator==(&local_70,"http://www.cellml.org/cellml/1.0#");
      local_11a = true;
      if (!bVar1) {
        peVar2 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        XmlAttribute::namespaceUri_abi_cxx11_(&local_90,peVar2);
        local_11a = std::operator==(&local_90,"http://www.cellml.org/cellml/1.1#");
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::~string((string *)&local_70);
      if (local_11a != false) {
        std::
        vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_40);
      }
      std::__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_40);
      XmlAttribute::next((XmlAttribute *)
                         &subAttributes.
                          super__Vector_base<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<libcellml::XmlAttribute>::operator=
                ((shared_ptr<libcellml::XmlAttribute> *)local_40,
                 (shared_ptr<libcellml::XmlAttribute> *)
                 &subAttributes.
                  super__Vector_base<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
                ((shared_ptr<libcellml::XmlAttribute> *)
                 &subAttributes.
                  super__Vector_base<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &tempAttribute.
                super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    XmlNode::firstChild((XmlNode *)&local_d0);
    attributesWithCellml1XNamespace
              ((vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
                *)local_c0,&local_d0);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_d0);
    local_e0._M_current =
         (shared_ptr<libcellml::XmlAttribute> *)
         std::
         vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::XmlAttribute>const*,std::vector<std::shared_ptr<libcellml::XmlAttribute>,std::allocator<std::shared_ptr<libcellml::XmlAttribute>>>>
    ::__normal_iterator<std::shared_ptr<libcellml::XmlAttribute>*>
              ((__normal_iterator<std::shared_ptr<libcellml::XmlAttribute>const*,std::vector<std::shared_ptr<libcellml::XmlAttribute>,std::allocator<std::shared_ptr<libcellml::XmlAttribute>>>>
                *)&local_d8,&local_e0);
    local_e8._M_current =
         (shared_ptr<libcellml::XmlAttribute> *)
         std::
         vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
         ::begin((vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
                  *)local_c0);
    local_f0 = (shared_ptr<libcellml::XmlAttribute> *)
               std::
               vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
               ::end((vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
                      *)local_c0);
    local_f8 = (shared_ptr<libcellml::XmlAttribute> *)
               std::
               vector<std::shared_ptr<libcellml::XmlAttribute>,std::allocator<std::shared_ptr<libcellml::XmlAttribute>>>
               ::
               insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::XmlAttribute>*,std::vector<std::shared_ptr<libcellml::XmlAttribute>,std::allocator<std::shared_ptr<libcellml::XmlAttribute>>>>,void>
                         ((vector<std::shared_ptr<libcellml::XmlAttribute>,std::allocator<std::shared_ptr<libcellml::XmlAttribute>>>
                           *)__return_storage_ptr__,local_d8,local_e8,
                          (__normal_iterator<std::shared_ptr<libcellml::XmlAttribute>_*,_std::vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>_>
                           )local_f0);
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &tempAttribute.
                super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    XmlNode::next((XmlNode *)&local_108);
    std::shared_ptr<libcellml::XmlNode>::operator=
              ((shared_ptr<libcellml::XmlNode> *)
               &tempAttribute.
                super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_108);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_108);
    std::
    vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
               *)local_c0);
    std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
              ((shared_ptr<libcellml::XmlAttribute> *)local_40);
  }
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)
             &tempAttribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::vector<XmlAttributePtr> attributesWithCellml1XNamespace(const XmlNodePtr &node)
{
    std::vector<XmlAttributePtr> attributes;

    auto tempNode = node;
    while (tempNode != nullptr) {
        auto tempAttribute = tempNode->firstAttribute();
        // Find attributes using old CellML namespace.
        while (tempAttribute != nullptr) {
            if (tempAttribute->namespaceUri() == CELLML_1_0_NS || tempAttribute->namespaceUri() == CELLML_1_1_NS) {
                attributes.push_back(tempAttribute);
            }
            tempAttribute = tempAttribute->next();
        }

        auto subAttributes = attributesWithCellml1XNamespace(tempNode->firstChild());

        // Append attributes found on child nodes.
        attributes.insert(attributes.end(), subAttributes.begin(), subAttributes.end());

        tempNode = tempNode->next();
    }

    return attributes;
}